

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ESoinn.cpp
# Opt level: O0

void __thiscall
nn::ESoinn::findMergedClasses
          (ESoinn *this,
          map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
          *node_axis,
          map<unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>_>
          *mergeClasses)

{
  ConcreteLogger *this_00;
  double dVar1;
  bool bVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  ulong uVar5;
  size_type sVar6;
  const_reference pvVar7;
  reference puVar8;
  mapped_type *pmVar9;
  double *pdVar10;
  set<unsigned_int,std::less<unsigned_int>,std::allocator<unsigned_int>> *psVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double local_c0;
  double local_b8;
  double local_b0;
  double min_density;
  double Bmax;
  double Amax;
  uint local_90;
  uint32_t B_axes;
  uint32_t A_axes;
  uint32_t num;
  iterator __end2;
  iterator __begin2;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__range2;
  vector<unsigned_int,_std::allocator<unsigned_int>_> neighbours;
  uint32_t i;
  allocator local_41;
  string local_40;
  map<unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>_>
  *local_20;
  map<unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>_>
  *mergeClasses_local;
  map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  *node_axis_local;
  ESoinn *this_local;
  
  this_00 = log_netw;
  local_20 = mergeClasses;
  mergeClasses_local =
       (map<unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>_>
        *)node_axis;
  node_axis_local =
       (map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
        *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_40,"findMergedClasses function",&local_41);
  logger::ConcreteLogger::debug(this_00,&local_40,false);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  neighbours.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
  do {
    uVar5 = (ulong)(uint)neighbours.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage;
    sVar6 = std::vector<neuron::ESoinnNeuron,_std::allocator<neuron::ESoinnNeuron>_>::size
                      (&this->m_Neurons);
    if (sVar6 <= uVar5) {
      return;
    }
    pvVar7 = std::vector<neuron::ESoinnNeuron,_std::allocator<neuron::ESoinnNeuron>_>::operator[]
                       (&this->m_Neurons,
                        (ulong)(uint)neighbours.
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
    bVar2 = neuron::ESoinnNeuron::is_deleted(pvVar7);
    if (!bVar2) {
      pvVar7 = std::vector<neuron::ESoinnNeuron,_std::allocator<neuron::ESoinnNeuron>_>::at
                         (&this->m_Neurons,
                          (ulong)(uint)neighbours.
                                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
      neuron::ESoinnNeuron::getNeighbours
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&__range2,pvVar7);
      __end2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&__range2);
      _A_axes = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&__range2);
      while (bVar2 = __gnu_cxx::operator!=
                               (&__end2,(__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                                         *)&A_axes), bVar2) {
        puVar8 = __gnu_cxx::
                 __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                 ::operator*(&__end2);
        B_axes = *puVar8;
        if ((uint)neighbours.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                  .super__Vector_impl_data._M_end_of_storage < B_axes) {
          pvVar7 = std::vector<neuron::ESoinnNeuron,_std::allocator<neuron::ESoinnNeuron>_>::at
                             (&this->m_Neurons,
                              (ulong)(uint)neighbours.
                                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
          uVar3 = neuron::ESoinnNeuron::curClass(pvVar7);
          pvVar7 = std::vector<neuron::ESoinnNeuron,_std::allocator<neuron::ESoinnNeuron>_>::at
                             (&this->m_Neurons,(ulong)B_axes);
          uVar4 = neuron::ESoinnNeuron::curClass(pvVar7);
          if (uVar3 != uVar4) {
            pmVar9 = std::
                     map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                     ::at((map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                           *)mergeClasses_local,
                          (key_type *)
                          &neighbours.
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage);
            local_90 = *pmVar9;
            pmVar9 = std::
                     map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                     ::at((map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                           *)mergeClasses_local,&B_axes);
            Amax._4_4_ = *pmVar9;
            if (local_90 == Amax._4_4_) {
              __assert_fail("A_axes != B_axes",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/fedyura[P]esoinn_text/src/neural_network/ESoinn.cpp"
                            ,0x16e,
                            "void nn::ESoinn::findMergedClasses(const std::map<uint32_t, uint32_t> &, std::map<uint32_t, std::set<uint32_t>> &) const"
                           );
            }
            pvVar7 = std::vector<neuron::ESoinnNeuron,_std::allocator<neuron::ESoinnNeuron>_>::at
                               (&this->m_Neurons,(ulong)local_90);
            Bmax = neuron::ESoinnNeuron::density(pvVar7);
            pvVar7 = std::vector<neuron::ESoinnNeuron,_std::allocator<neuron::ESoinnNeuron>_>::at
                               (&this->m_Neurons,(ulong)Amax._4_4_);
            min_density = neuron::ESoinnNeuron::density(pvVar7);
            pvVar7 = std::vector<neuron::ESoinnNeuron,_std::allocator<neuron::ESoinnNeuron>_>::at
                               (&this->m_Neurons,
                                (ulong)(uint)neighbours.
                                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
            local_b8 = neuron::ESoinnNeuron::density(pvVar7);
            pvVar7 = std::vector<neuron::ESoinnNeuron,_std::allocator<neuron::ESoinnNeuron>_>::at
                               (&this->m_Neurons,(ulong)B_axes);
            local_c0 = neuron::ESoinnNeuron::density(pvVar7);
            pdVar10 = std::min<double>(&local_b8,&local_c0);
            dVar1 = Bmax;
            dVar14 = *pdVar10;
            local_b0 = dVar14;
            dVar12 = meanDensity(this,local_90);
            dVar13 = getAlpha(this,dVar1,dVar12);
            dVar12 = min_density;
            dVar1 = local_b0;
            if (dVar14 <= dVar13 * Bmax) {
              dVar14 = meanDensity(this,Amax._4_4_);
              dVar14 = getAlpha(this,dVar12,dVar14);
              if (dVar1 <= dVar14 * min_density) goto LAB_001aee95;
            }
            psVar11 = (set<unsigned_int,std::less<unsigned_int>,std::allocator<unsigned_int>> *)
                      std::
                      map<unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>_>
                      ::operator[](local_20,&local_90);
            std::set<unsigned_int,std::less<unsigned_int>,std::allocator<unsigned_int>>::
            emplace<unsigned_int_const&>(psVar11,(uint *)((long)&Amax + 4));
            psVar11 = (set<unsigned_int,std::less<unsigned_int>,std::allocator<unsigned_int>> *)
                      std::
                      map<unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>_>
                      ::operator[](local_20,(key_type *)((long)&Amax + 4));
            std::set<unsigned_int,std::less<unsigned_int>,std::allocator<unsigned_int>>::
            emplace<unsigned_int_const&>(psVar11,&local_90);
          }
        }
LAB_001aee95:
        __gnu_cxx::
        __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
        ::operator++(&__end2);
      }
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&__range2);
    }
    neighbours.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._0_4_ =
         (uint)neighbours.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage + 1;
  } while( true );
}

Assistant:

void ESoinn::findMergedClasses(const std::map<uint32_t, uint32_t>& node_axis, std::map<uint32_t, std::set<uint32_t>>& mergeClasses) const
    {
        log_netw->debug("findMergedClasses function");
        //iterate all edges
        for (uint32_t i = 0; i < m_Neurons.size(); i++)
        {
            if (m_Neurons[i].is_deleted())
                continue;
            
            std::vector<uint32_t> neighbours = m_Neurons.at(i).getNeighbours();
            for (uint32_t num: neighbours)
            {
                if (num <= i)
                    continue;
                
                if (m_Neurons.at(i).curClass() != m_Neurons.at(num).curClass())
                {
                    const uint32_t A_axes = node_axis.at(i);
                    const uint32_t B_axes = node_axis.at(num);
                    assert(A_axes != B_axes);
                        
                    const double Amax = m_Neurons.at(A_axes).density();
                    const double Bmax = m_Neurons.at(B_axes).density();
                    const double min_density = std::min(m_Neurons.at(i).density(), m_Neurons.at(num).density());
                    if (min_density > getAlpha(Amax, meanDensity(A_axes)) * Amax ||
                        min_density > getAlpha(Bmax, meanDensity(B_axes)) * Bmax)
                    {
                        //Add two classes as need to merge 
                        mergeClasses[A_axes].emplace(B_axes);
                        mergeClasses[B_axes].emplace(A_axes);
                    }
                }
            }
        }
    }